

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftutil.c
# Opt level: O1

FT_Pointer ft_mem_strdup(FT_Memory memory,char *str,FT_Error *p_error)

{
  size_t sVar1;
  void *__dest;
  int iVar2;
  
  if (str == (char *)0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = strlen(str);
    sVar1 = sVar1 + 1;
  }
  if ((long)sVar1 < 1) {
    __dest = (void *)0x0;
    iVar2 = 6;
    if (sVar1 == 0) {
      iVar2 = 0;
    }
  }
  else {
    __dest = (*memory->alloc)(memory,sVar1);
    iVar2 = (uint)(__dest == (void *)0x0) << 6;
  }
  if ((str != (char *)0x0) && (iVar2 == 0)) {
    memcpy(__dest,str,sVar1);
  }
  *p_error = iVar2;
  return __dest;
}

Assistant:

FT_BASE_DEF( FT_Pointer )
  ft_mem_strdup( FT_Memory    memory,
                 const char*  str,
                 FT_Error    *p_error )
  {
    FT_ULong  len = str ? (FT_ULong)ft_strlen( str ) + 1
                        : 0;


    return ft_mem_dup( memory, str, len, p_error );
  }